

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O3

void __thiscall
toml::result<toml::basic_value<toml::type_config>,_toml::error_info>::cleanup
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *this,EVP_PKEY_CTX *ctx)

{
  if (this->is_ok_ == true) {
    basic_value<toml::type_config>::cleanup(&(this->field_1).succ_.value,ctx);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(this->field_1).succ_.value.comments_);
    toml::detail::region::~region(&(this->field_1).succ_.value.region_);
    return;
  }
  failure<toml::error_info>::~failure((failure<toml::error_info> *)&(this->field_1).succ_);
  return;
}

Assistant:

void cleanup() noexcept
    {
#if defined(__GNUC__) && ! defined(__clang__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wduplicated-branches"
#endif

        if(this->is_ok_) {this->succ_.~success_type();}
        else             {this->fail_.~failure_type();}

#if defined(__GNUC__) && ! defined(__clang__)
#pragma GCC diagnostic pop
#endif
        return;
    }